

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void el::Loggers::configureFromGlobal(char *globalConfigurationFilePath)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  ulong uVar5;
  char *in_RDI;
  anon_class_16_2_58e2ca49 configure;
  Logger *logger;
  stringstream ss;
  string line;
  stringstream internalInfoStream;
  ifstream gcfStream;
  bool local_6d1;
  Logger *in_stack_fffffffffffff938;
  string *in_stack_fffffffffffff940;
  bool local_6a3;
  undefined1 in_stack_fffffffffffff95f;
  string *in_stack_fffffffffffff960;
  bool local_68b;
  string *in_stack_fffffffffffff980;
  anon_class_16_2_58e2ca49 *in_stack_fffffffffffff9b0;
  string local_638 [32];
  string local_618;
  allocator local_5f1;
  string local_5f0 [32];
  string local_5d0 [37];
  byte local_5ab;
  byte local_5aa;
  allocator local_5a9;
  string local_5a8 [32];
  stringstream *local_588;
  Logger **local_580;
  Logger *local_578;
  stringstream local_570 [16];
  ostream local_560 [376];
  string local_3e8 [32];
  string local_3c8 [32];
  stringstream local_3a8 [16];
  ostream local_398 [392];
  istream local_210 [520];
  char *local_8;
  
  local_8 = in_RDI;
  std::ifstream::ifstream(local_210,in_RDI,_S_in);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_3a8);
    in_stack_fffffffffffff9b0 =
         (anon_class_16_2_58e2ca49 *)
         std::operator<<(local_398,"Unable to open global configuration file [");
    poVar4 = std::operator<<((ostream *)in_stack_fffffffffffff9b0,local_8);
    std::operator<<(poVar4,"] for parsing.");
    poVar4 = std::operator<<((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xb62);
    poVar4 = std::operator<<(poVar4,") [gcfStream.is_open()");
    poVar4 = std::operator<<(poVar4,"] WITH MESSAGE \"");
    std::__cxx11::stringstream::str();
    in_stack_fffffffffffff980 = (string *)std::operator<<(poVar4,local_3c8);
    poVar4 = std::operator<<((ostream *)in_stack_fffffffffffff980,"\"");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_3c8);
    std::__cxx11::stringstream::~stringstream(local_3a8);
  }
  std::__cxx11::string::string(local_3e8);
  std::__cxx11::stringstream::stringstream(local_570);
  local_578 = (Logger *)0x0;
  local_588 = local_570;
  local_580 = &local_578;
  while (bVar1 = std::ios::good(), (bVar1 & 1) != 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_210,local_3e8);
    el::base::utils::Str::trim((string *)0x274eeb);
    bVar2 = Configurations::Parser::isComment(in_stack_fffffffffffff980);
    if (!bVar2) {
      Configurations::Parser::ignoreComments(in_stack_fffffffffffff960);
      el::base::utils::Str::trim((string *)0x274f5a);
      uVar5 = std::__cxx11::string::size();
      local_5aa = 0;
      local_5ab = 0;
      local_68b = false;
      if (2 < uVar5) {
        in_stack_fffffffffffff960 = (string *)el::base::consts::kConfigurationLoggerId;
        std::allocator<char>::allocator();
        local_5aa = 1;
        std::__cxx11::string::string(local_5a8,(char *)in_stack_fffffffffffff960,&local_5a9);
        local_5ab = 1;
        in_stack_fffffffffffff95f =
             el::base::utils::Str::startsWith
                       (in_stack_fffffffffffff940,(string *)in_stack_fffffffffffff938);
        local_68b = (bool)in_stack_fffffffffffff95f;
      }
      if ((local_5ab & 1) != 0) {
        std::__cxx11::string::~string(local_5a8);
      }
      if ((local_5aa & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
      }
      if (local_68b == false) {
        poVar4 = std::operator<<(local_560,local_3e8);
        std::operator<<(poVar4,"\n");
      }
      else {
        std::__cxx11::stringstream::str();
        uVar3 = std::__cxx11::string::empty();
        local_6a3 = (uVar3 & 1) == 0 && local_578 != (Logger *)0x0;
        std::__cxx11::string::~string(local_5d0);
        if (local_6a3) {
          configureFromGlobal::anon_class_16_2_58e2ca49::operator()(in_stack_fffffffffffff9b0);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5f0,"",&local_5f1);
        std::__cxx11::stringstream::str((string *)local_570);
        std::__cxx11::string::~string(local_5f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
        std::__cxx11::string::substr((ulong)&local_618,(ulong)local_3e8);
        in_stack_fffffffffffff940 = &local_618;
        std::__cxx11::string::operator=(local_3e8,(string *)in_stack_fffffffffffff940);
        std::__cxx11::string::~string((string *)in_stack_fffffffffffff940);
        el::base::utils::Str::trim((string *)0x2751c3);
        uVar5 = std::__cxx11::string::size();
        if (1 < uVar5) {
          in_stack_fffffffffffff938 =
               getLogger(in_stack_fffffffffffff960,(bool)in_stack_fffffffffffff95f);
          local_578 = in_stack_fffffffffffff938;
        }
      }
    }
  }
  std::__cxx11::stringstream::str();
  uVar3 = std::__cxx11::string::empty();
  local_6d1 = (uVar3 & 1) == 0 && local_578 != (Logger *)0x0;
  std::__cxx11::string::~string(local_638);
  if (local_6d1) {
    configureFromGlobal::anon_class_16_2_58e2ca49::operator()(in_stack_fffffffffffff9b0);
  }
  std::__cxx11::stringstream::~stringstream(local_570);
  std::__cxx11::string::~string(local_3e8);
  std::ifstream::~ifstream(local_210);
  return;
}

Assistant:

void Loggers::configureFromGlobal(const char* globalConfigurationFilePath) {
  std::ifstream gcfStream(globalConfigurationFilePath, std::ifstream::in);
  ELPP_ASSERT(gcfStream.is_open(), "Unable to open global configuration file [" << globalConfigurationFilePath
              << "] for parsing.");
  std::string line = std::string();
  std::stringstream ss;
  Logger* logger = nullptr;
  auto configure = [&](void) {
    ELPP_INTERNAL_INFO(8, "Configuring logger: '" << logger->id() << "' with configurations \n" << ss.str()
                       << "\n--------------");
    Configurations c;
    c.parseFromText(ss.str());
    logger->configure(c);
  };
  while (gcfStream.good()) {
    std::getline(gcfStream, line);
    ELPP_INTERNAL_INFO(1, "Parsing line: " << line);
    base::utils::Str::trim(line);
    if (Configurations::Parser::isComment(line)) continue;
    Configurations::Parser::ignoreComments(&line);
    base::utils::Str::trim(line);
    if (line.size() > 2 && base::utils::Str::startsWith(line, std::string(base::consts::kConfigurationLoggerId))) {
      if (!ss.str().empty() && logger != nullptr) {
        configure();
      }
      ss.str(std::string(""));
      line = line.substr(2);
      base::utils::Str::trim(line);
      if (line.size() > 1) {
        ELPP_INTERNAL_INFO(1, "Getting logger: '" << line << "'");
        logger = getLogger(line);
      }
    } else {
      ss << line << "\n";
    }
  }
  if (!ss.str().empty() && logger != nullptr) {
    configure();
  }
}